

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_common.cpp
# Opt level: O2

RK_S32 axb_div_c(RK_S32 a,RK_S32 b,RK_S32 c)

{
  int iVar1;
  uint uVar3;
  uint uVar2;
  
  iVar1 = 0;
  if (b != 0 && a != 0) {
    if (c != 0) {
      return (b * a) / c;
    }
    uVar3 = a >> 0x1f | 1;
    uVar2 = -uVar3;
    if (-1 < b) {
      uVar2 = uVar3;
    }
    iVar1 = uVar2 * 0x7fffffff;
  }
  return iVar1;
}

Assistant:

RK_S32 axb_div_c(RK_S32 a, RK_S32 b, RK_S32 c)
{
    RK_U32 left = 32;
    RK_U32 right = 0;
    RK_U32 shift;
    RK_S32 sign = 1;
    RK_S32 tmp;

    if (a == 0 || b == 0)
        return 0;
    else if ((a * b / b) == a && c != 0)
        return (a * b / c);

    if (a < 0) {
        sign = -1;
        a = -a;
    }
    if (b < 0) {
        sign *= -1;
        b = -b;
    }
    if (c < 0) {
        sign *= -1;
        c = -c;
    }

    if (c == 0)
        return 0x7FFFFFFF * sign;

    if (b > a) {
        tmp = b;
        b = a;
        a = tmp;
    }

    for (--left; (((RK_U32)a << left) >> left) != (RK_U32)a; --left)
        ;

    left--;

    while (((RK_U32)b >> right) > (RK_U32)c)
        right++;

    if (right > left) {
        return 0x7FFFFFFF * sign;
    } else {
        shift = left - right;
        return (RK_S32)((((RK_U32)a << shift) /
                         (RK_U32)c * (RK_U32)b) >> shift) * sign;
    }
}